

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,SwitchStmt *stmt)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator __position;
  ulong uVar2;
  pointer pcVar3;
  undefined1 *local_40;
  string var;
  
  peVar1 = (stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (*(peVar1->super_IRNode)._vptr_IRNode[0x1f])(&local_40);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  uVar2 = 0xcbf29ce484222325;
  if (var._M_dataplus._M_p == (pointer)0x0) {
    uVar2 = 0xcbf29ce484222325;
  }
  else {
    pcVar3 = (pointer)0x0;
    do {
      uVar2 = ((byte)local_40[(long)pcVar3] ^ uVar2) * 0x100000001b3;
      pcVar3 = pcVar3 + 1;
    } while (var._M_dataplus._M_p != pcVar3);
  }
  var.field_2._8_8_ = uVar2 << ((byte)(this->super_IRVisitor).level & 0x3f) ^ 0x78dde6e5fd29f05a;
  __position._M_current =
       (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->stmt_hashes_,__position,(unsigned_long *)(var.field_2._M_local_buf + 8));
  }
  else {
    *__position._M_current = var.field_2._8_8_;
    (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if ((size_type *)local_40 != &var._M_string_length) {
    operator_delete(local_40,var._M_string_length + 1);
  }
  return;
}

Assistant:

void visit(SwitchStmt* stmt) override {
        constexpr uint64_t switch_signature = shift_const(0x9e3779b97f4a7c16, 2);
        auto var = stmt->target()->to_string();
        uint64_t hash = hash_64_fnv1a(var.c_str(), var.size()) << level;
        stmt_hashes_.emplace_back(switch_signature ^ hash);
    }